

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBinaryReader::ReadMemorySection(WasmBinaryReader *this,bool isImportSection)

{
  bool bVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  char16_t *msg;
  WasmBinaryReader *this_00;
  SectionLimits SVar3;
  SectionLimits local_28;
  uint32 local_1c [2];
  uint32 length;
  
  local_1c[0] = 0;
  if ((int)CONCAT71(in_register_00000031,isImportSection) == 0) {
    this_00 = this;
    uVar2 = LEB128<unsigned_int,32u>(this,local_1c);
    if (1 < uVar2) {
      msg = L"Maximum of 1 memory allowed";
      goto LAB_00f115ff;
    }
    if (uVar2 != 1) {
      return;
    }
  }
  this_00 = this;
  SVar3 = (SectionLimits)
          ReadSectionLimitsBase<Wasm::MemorySectionLimits>
                    (this,-(uint)DAT_015932e2 | 0x7fff,-(uint)DAT_015932e2 | 0x10000,
                     L"memory size too big");
  local_28 = SVar3;
  bVar1 = Threads::IsEnabled();
  if ((!bVar1) || ((SVar3.flags & 3) != 2)) {
    Js::WebAssemblyModule::InitializeMemory(this->m_module,(MemorySectionLimits *)&local_28);
    return;
  }
  msg = L"Shared memory must have a maximum size";
LAB_00f115ff:
  ThrowDecodingError(this_00,msg);
}

Assistant:

void WasmBinaryReader::ReadMemorySection(bool isImportSection)
{
    uint32 length = 0;
    uint32 count;
    if (isImportSection)
    {
        count = 1;
    }
    else
    {
        count = LEB128(length);
    }
    if (count > 1)
    {
        ThrowDecodingError(_u("Maximum of 1 memory allowed"));
    }

    if (count == 1)
    {
        MemorySectionLimits limits = ReadSectionLimitsBase<MemorySectionLimits>(Limits::GetMaxMemoryInitialPages(), Limits::GetMaxMemoryMaximumPages(), _u("memory size too big"));
        if (Wasm::Threads::IsEnabled() && limits.IsShared() && !limits.HasMaximum())
        {
            ThrowDecodingError(_u("Shared memory must have a maximum size"));
        }
        m_module->InitializeMemory(&limits);
    }
}